

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

void __thiscall
poly::
vector<Interface,_std::allocator<Interface>,_poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>_>
::obtain_storage(vector<Interface,_std::allocator<Interface>,_poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>_>
                 *this,allocator_base<std::allocator<unsigned_char>_> *a,difference_type n,
                vector_elem_ptr<poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>,_std::allocator_traits<std::allocator<Interface>_>_>
                *max_align)

{
  void_pointer dst_ptr;
  elem_ptr_pointer begin;
  elem_ptr_pointer _free;
  elem_ptr_pointer __x;
  vector_elem_ptr<poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>,_std::allocator_traits<std::allocator<Interface>_>_>
  *end;
  my_base *this_00;
  poly_copy_descr local_68;
  undefined1 auStack_48 [8];
  poly_copy_descr ret;
  size_t max_align_local;
  size_t n_local;
  my_base *a_local;
  vector<Interface,_std::allocator<Interface>,_poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>_>
  *this_local;
  
  this->_align_max = (size_t)max_align;
  ret.
  super__Tuple_impl<0UL,_poly::vector_elem_ptr<poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>,_std::allocator_traits<std::allocator<Interface>_>_>_*,_poly::vector_elem_ptr<poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>,_std::allocator_traits<std::allocator<Interface>_>_>_*,_void_*>
  .
  super__Head_base<0UL,_poly::vector_elem_ptr<poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>,_std::allocator_traits<std::allocator<Interface>_>_>_*,_false>
  ._M_head_impl = max_align;
  dst_ptr = vector_impl::allocator_base<std::allocator<unsigned_char>_>::storage(a);
  begin = begin_elem(this);
  _free = end_elem(this);
  __x = begin_elem(this);
  end = std::
        next<poly::vector_elem_ptr<poly::delegate_cloning_policy<Interface,std::allocator<Interface>,std::integral_constant<bool,true>>,std::allocator_traits<std::allocator<Interface>>>*>
                  (__x,n);
  poly_uninitialized_move
            ((poly_copy_descr *)auStack_48,a,dst_ptr,begin,_free,end,
             (size_t)ret.
                     super__Tuple_impl<0UL,_poly::vector_elem_ptr<poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>,_std::allocator_traits<std::allocator<Interface>_>_>_*,_poly::vector_elem_ptr<poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>,_std::allocator_traits<std::allocator<Interface>_>_>_*,_void_*>
                     .
                     super__Head_base<0UL,_poly::vector_elem_ptr<poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>,_std::allocator_traits<std::allocator<Interface>_>_>_*,_false>
                     ._M_head_impl);
  tidy(this);
  this_00 = base(this);
  vector_impl::allocator_base<std::allocator<unsigned_char>_>::swap(this_00,a);
  local_68.
  super__Tuple_impl<0UL,_poly::vector_elem_ptr<poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>,_std::allocator_traits<std::allocator<Interface>_>_>_*,_poly::vector_elem_ptr<poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>,_std::allocator_traits<std::allocator<Interface>_>_>_*,_void_*>
  .
  super__Head_base<0UL,_poly::vector_elem_ptr<poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>,_std::allocator_traits<std::allocator<Interface>_>_>_*,_false>
  ._M_head_impl =
       ret.
       super__Tuple_impl<0UL,_poly::vector_elem_ptr<poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>,_std::allocator_traits<std::allocator<Interface>_>_>_*,_poly::vector_elem_ptr<poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>,_std::allocator_traits<std::allocator<Interface>_>_>_*,_void_*>
       .
       super__Tuple_impl<1UL,_poly::vector_elem_ptr<poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>,_std::allocator_traits<std::allocator<Interface>_>_>_*,_void_*>
       .
       super__Head_base<1UL,_poly::vector_elem_ptr<poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>,_std::allocator_traits<std::allocator<Interface>_>_>_*,_false>
       ._M_head_impl;
  local_68.
  super__Tuple_impl<0UL,_poly::vector_elem_ptr<poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>,_std::allocator_traits<std::allocator<Interface>_>_>_*,_poly::vector_elem_ptr<poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>,_std::allocator_traits<std::allocator<Interface>_>_>_*,_void_*>
  .
  super__Tuple_impl<1UL,_poly::vector_elem_ptr<poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>,_std::allocator_traits<std::allocator<Interface>_>_>_*,_void_*>
  .super__Tuple_impl<2UL,_void_*>.super__Head_base<2UL,_void_*,_false>._M_head_impl =
       (_Head_base<2UL,_void_*,_false>)(_Head_base<2UL,_void_*,_false>)auStack_48;
  local_68.
  super__Tuple_impl<0UL,_poly::vector_elem_ptr<poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>,_std::allocator_traits<std::allocator<Interface>_>_>_*,_poly::vector_elem_ptr<poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>,_std::allocator_traits<std::allocator<Interface>_>_>_*,_void_*>
  .
  super__Tuple_impl<1UL,_poly::vector_elem_ptr<poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>,_std::allocator_traits<std::allocator<Interface>_>_>_*,_void_*>
  .
  super__Head_base<1UL,_poly::vector_elem_ptr<poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>,_std::allocator_traits<std::allocator<Interface>_>_>_*,_false>
  ._M_head_impl =
       (vector_elem_ptr<poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>,_std::allocator_traits<std::allocator<Interface>_>_>
        *)ret.
          super__Tuple_impl<0UL,_poly::vector_elem_ptr<poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>,_std::allocator_traits<std::allocator<Interface>_>_>_*,_poly::vector_elem_ptr<poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>,_std::allocator_traits<std::allocator<Interface>_>_>_*,_void_*>
          .
          super__Tuple_impl<1UL,_poly::vector_elem_ptr<poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>,_std::allocator_traits<std::allocator<Interface>_>_>_*,_void_*>
          .super__Tuple_impl<2UL,_void_*>.super__Head_base<2UL,_void_*,_false>._M_head_impl;
  set_ptrs(this,&local_68);
  this->_align_max =
       (size_t)ret.
               super__Tuple_impl<0UL,_poly::vector_elem_ptr<poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>,_std::allocator_traits<std::allocator<Interface>_>_>_*,_poly::vector_elem_ptr<poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>,_std::allocator_traits<std::allocator<Interface>_>_>_*,_void_*>
               .
               super__Head_base<0UL,_poly::vector_elem_ptr<poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>,_std::allocator_traits<std::allocator<Interface>_>_>_*,_false>
               ._M_head_impl;
  return;
}

Assistant:

inline void vector<I, A, C>::obtain_storage(
    my_base&& a, size_t n, size_t max_align, std::false_type /*unused*/) noexcept
{
    _align_max = max_align;
    auto ret   = poly_uninitialized_move(
        a, a.storage(), begin_elem(), end_elem(), std::next(begin_elem(), n), max_align);
    tidy();
    base().swap(a);
    set_ptrs(ret);
    _align_max = max_align;
}